

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

bool __thiscall
llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
     ,Option *param_1,StringRef param_2,StringRef Arg,string *Value)

{
  StringRef local_40;
  string local_30;
  
  local_40.Length = Arg.Length;
  local_40.Data = Arg.Data;
  StringRef::str_abi_cxx11_(&local_30,&local_40);
  std::__cxx11::string::operator=((string *)Value,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return false;
}

Assistant:

bool parse(Option &, StringRef, StringRef Arg, std::string &Value) {
    Value = Arg.str();
    return false;
  }